

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O1

int set_reasons(ASN1_BIT_STRING **preas,char *value)

{
  char *__s2;
  bool bVar1;
  BIT_STRING_BITNAME *pBVar2;
  int iVar3;
  OPENSSL_STACK *sk;
  size_t sVar4;
  void *pvVar5;
  ASN1_BIT_STRING *pAVar6;
  size_t sVar7;
  uint uVar8;
  BIT_STRING_BITNAME *pBVar9;
  bool bVar10;
  bool local_31;
  
  if (*preas == (ASN1_BIT_STRING *)0x0) {
    sk = (OPENSSL_STACK *)X509V3_parse_list(value);
    if (sk == (OPENSSL_STACK *)0x0) {
      uVar8 = 0;
    }
    else {
      sVar4 = OPENSSL_sk_num(sk);
      local_31 = sVar4 == 0;
      if (!local_31) {
        sVar4 = 0;
        do {
          pvVar5 = OPENSSL_sk_value(sk,sVar4);
          __s2 = *(char **)((long)pvVar5 + 8);
          if (*preas == (ASN1_BIT_STRING *)0x0) {
            pAVar6 = ASN1_BIT_STRING_new();
            *preas = (ASN1_BIT_STRING *)pAVar6;
            if (pAVar6 == (ASN1_BIT_STRING *)0x0) break;
          }
          iVar3 = strcmp("unused",__s2);
          if (iVar3 == 0) {
            bVar1 = true;
            pBVar9 = reason_flags;
          }
          else {
            pBVar9 = reason_flags;
            do {
              bVar10 = pBVar9[1].lname == (char *)0x0;
              bVar1 = !bVar10;
              if (bVar10) goto LAB_004afb29;
              pBVar2 = pBVar9 + 1;
              pBVar9 = pBVar9 + 1;
              iVar3 = strcmp(pBVar2->sname,__s2);
            } while (iVar3 != 0);
          }
          iVar3 = ASN1_BIT_STRING_set_bit((ASN1_BIT_STRING *)*preas,pBVar9->bitnum,1);
          if ((iVar3 == 0) || (!bVar1)) break;
          sVar4 = sVar4 + 1;
          sVar7 = OPENSSL_sk_num(sk);
          local_31 = sVar7 <= sVar4;
          if (local_31) break;
        } while( true );
      }
LAB_004afb29:
      uVar8 = (uint)local_31;
      OPENSSL_sk_pop_free_ex(sk,sk_CONF_VALUE_call_free_func,X509V3_conf_free);
    }
  }
  else {
    uVar8 = 0;
    ERR_put_error(0x14,0,0xa3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_crld.cc"
                  ,0xb3);
  }
  return uVar8;
}

Assistant:

static int set_reasons(ASN1_BIT_STRING **preas, const char *value) {
  if (*preas) {
    // Duplicate "reasons" or "onlysomereasons" key.
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_VALUE);
    return 0;
  }
  int ret = 0;
  STACK_OF(CONF_VALUE) *rsk = X509V3_parse_list(value);
  if (!rsk) {
    return 0;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(rsk); i++) {
    const char *bnam = sk_CONF_VALUE_value(rsk, i)->name;
    if (!*preas) {
      *preas = ASN1_BIT_STRING_new();
      if (!*preas) {
        goto err;
      }
    }
    const BIT_STRING_BITNAME *pbn;
    for (pbn = reason_flags; pbn->lname; pbn++) {
      if (!strcmp(pbn->sname, bnam)) {
        if (!ASN1_BIT_STRING_set_bit(*preas, pbn->bitnum, 1)) {
          goto err;
        }
        break;
      }
    }
    if (!pbn->lname) {
      goto err;
    }
  }
  ret = 1;

err:
  sk_CONF_VALUE_pop_free(rsk, X509V3_conf_free);
  return ret;
}